

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

int __thiscall
QtPrivate::QGenericArrayOps<QCss::Declaration>::truncate
          (QGenericArrayOps<QCss::Declaration> *this,char *__file,__off_t __length)

{
  Declaration *pDVar1;
  Declaration *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QCss::Declaration> *this_00;
  
  pDVar1 = QArrayDataPointer<QCss::Declaration>::begin
                     ((QArrayDataPointer<QCss::Declaration> *)0x48c4a1);
  this_00 = (QArrayDataPointer<QCss::Declaration> *)(pDVar1 + (long)__file);
  QArrayDataPointer<QCss::Declaration>::end(this_00);
  std::destroy<QCss::Declaration*>((Declaration *)this_00,in_stack_ffffffffffffffd8);
  (this->super_QArrayDataPointer<QCss::Declaration>).size = (qsizetype)__file;
  return (int)this;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }